

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxhash.c
# Opt level: O0

unsigned_short stringequalhash(LispPTR obj)

{
  ushort uVar1;
  uint LAddr;
  LispPTR *pLVar2;
  LispPTR *local_80;
  uint *local_78;
  uint local_64;
  undefined1 *puStack_60;
  uint i_1;
  char *thin;
  undefined1 *puStack_50;
  uint i;
  unsigned_short *fat;
  OneDArray *str;
  PLCell *Prop;
  DLword *base;
  PNCell *pnptr;
  uint uStack_1c;
  unsigned_short hash;
  uint ind;
  uint fatp;
  uint offset;
  uint len;
  LispPTR obj_local;
  
  pnptr._6_2_ = 0;
  uVar1 = (ushort)(obj >> 0x10);
  switch(*(ushort *)((ulong)(MDStypetbl + (obj >> 9)) ^ 2) & 0x7ff) {
  case 4:
  case 0x15:
    LAddr = obj & 0xfffffff;
    if ((obj & 0xfff0000) == 0) {
      local_78 = (uint *)(AtomSpace + (ulong)(LAddr * 5) * 2);
    }
    else {
      local_78 = NativeAligned4FromLAddr(LAddr);
    }
    Prop = (PLCell *)NativeAligned2FromLAddr(*local_78 & 0xfffffff);
    if ((obj & 0xfff0000) == 0) {
      local_80 = (LispPTR *)(AtomSpace + (ulong)(LAddr * 5) * 2);
    }
    else {
      local_80 = NativeAligned4FromLAddr(LAddr);
    }
    local_80 = local_80 + 3;
    uStack_1c = (uint)((ulong)*(undefined8 *)local_80 >> 0x2d) & 1;
    ind = 1;
    fatp = (uint)*(byte *)((ulong)Prop ^ 3);
    break;
  default:
    return uVar1 ^ (ushort)((obj & 0x1fff) << 3) ^ (ushort)(obj >> 9) & 0x7f;
  case 0xe:
  case 0x10:
    pLVar2 = NativeAligned4FromLAddr(obj);
    if ((*(ushort *)((long)pLVar2 + 6) >> 0xc & 1) == 0) {
      return uVar1 ^ (ushort)((obj & 0x1fff) << 3) ^ (ushort)(obj >> 9) & 0x7f;
    }
    uStack_1c = (uint)((*(ushort *)((long)pLVar2 + 6) & 0xff) == 0x44);
    Prop = (PLCell *)NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
    ind = (uint)(ushort)pLVar2[1];
    fatp = pLVar2[2];
  }
  if (uStack_1c == 0) {
    puStack_60 = &Prop->field_0x0 + ind;
    for (local_64 = 0; local_64 < fatp; local_64 = local_64 + 1) {
      pnptr._6_2_ = (pnptr._6_2_ + (pnptr._6_2_ & 0xfff) * 4) * 0x101 +
                    (*(byte *)((ulong)puStack_60 ^ 3) | 0x20);
      puStack_60 = puStack_60 + 1;
    }
  }
  else {
    puStack_50 = &Prop->field_0x0 + (ulong)ind * 2;
    for (thin._4_4_ = 0; thin._4_4_ < fatp; thin._4_4_ = thin._4_4_ + 1) {
      pnptr._6_2_ = (pnptr._6_2_ + (pnptr._6_2_ & 0xfff) * 4) * 0x101 +
                    (*(ushort *)((ulong)puStack_50 ^ 2) | 0x20);
      puStack_50 = puStack_50 + 2;
    }
  }
  return pnptr._6_2_;
}

Assistant:

static unsigned short stringequalhash(LispPTR obj) {
  unsigned len, offset, fatp, ind;
  unsigned short hash = 0;
  PNCell *pnptr;
  DLword *base;
  PLCell *Prop;
  OneDArray *str;
  switch (GetTypeNumber(obj)) {
#ifdef BIGATOMS
    case TYPE_NEWATOM: /* as for LITATOM; it's all in the macros below. */
#endif                 /* BIGATOMS */

    case TYPE_LITATOM:
      ind = ((int)obj) & POINTERMASK;
      pnptr = (PNCell *)GetPnameCell(ind);
      base = (DLword *)NativeAligned2FromLAddr(pnptr->pnamebase);
      Prop = (PLCell *)GetPropCell(ind);
      fatp = Prop->fatpnamep;
      offset = 1;
      len = GETBYTE((unsigned char *)base);
      break;
    case TYPE_ONED_ARRAY:
    case TYPE_GENERAL_ARRAY:
      str = (OneDArray *)NativeAligned4FromLAddr(obj);
      if (str->stringp) {
        fatp = (str->typenumber) == FAT_CHAR_TYPENUMBER;
        base = NativeAligned2FromLAddr(str->base);
        offset = str->offset;
        len = str->fillpointer;
      } else
        return (EQHASHINGBITS(obj));
      break;
    default: return (EQHASHINGBITS(obj));
  }

  if (fatp) {
    unsigned short *fat;
    unsigned i;
    fat = ((unsigned short *)base) + offset;
    for (i = 0; i < len; i++) {
      hash = hash + ((hash & 0xFFF) << 2);
      hash = hash + (0x20 | GETWORD(fat++)) + ((hash & 0xFF) << 8);
    }
  } else {
    char *thin;
    unsigned i;
    thin = ((char *)base) + offset;
    for (i = 0; i < len; i++) {
      hash = hash + ((hash & 0xFFF) << 2);
      hash = hash + (0x20 | GETBYTE(thin++)) + ((hash & 0xFF) << 8);
    }
  }
  return (hash);
}